

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O2

void __thiscall
streams_tests::streams_buffered_file_rand::test_method(streams_buffered_file_rand *this)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  uint8_t uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  unsigned_long nRewindIn;
  unsigned_long uVar9;
  iterator in_R8;
  iterator pvVar10;
  bool *in_R9;
  iterator pvVar11;
  uint8_t *puVar12;
  uint uVar13;
  FastRandomContext *this_00;
  uint8_t i;
  byte obj;
  long lVar14;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar15;
  ulong local_330;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  bool okay;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  uint8_t i_1;
  undefined7 uStack_16f;
  char *local_168;
  lazy_ostream local_160;
  undefined1 *local_150;
  uint8_t *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  size_t currentPos;
  BufferedFile bf;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_d8;
  AutoFile local_c0;
  uint8_t a [1];
  undefined7 uStack_9f;
  shared_count sStack_90;
  path local_88;
  path streams_test_filename;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,ZEROS);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&streams_test_filename,(path *)&local_88,"streams_test_tmp");
  std::filesystem::__cxx11::path::~path(&local_88);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  iVar7 = 0;
  do {
    if (iVar7 == 0x32) {
      std::filesystem::remove((path *)&streams_test_filename);
      std::filesystem::__cxx11::path::~path(&streams_test_filename.super_path);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return;
    }
    local_c0.m_file = (FILE *)fsbridge::fopen((char *)&streams_test_filename,"w+b");
    local_c0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_d8);
    iVar6 = RandomMixin<FastRandomContext>::randrange<int>
                      (&this_00->super_RandomMixin<FastRandomContext>,0x100);
    uVar8 = (ulong)iVar6;
    for (obj = 0; obj < uVar8; obj = obj + 1) {
      ser_writedata8<AutoFile>(&local_c0,obj);
    }
    rewind((FILE *)local_c0.m_file);
    iVar6 = RandomMixin<FastRandomContext>::randrange<int>
                      (&this_00->super_RandomMixin<FastRandomContext>,300);
    nRewindIn = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                          (&this_00->super_RandomMixin<FastRandomContext>,(long)(iVar6 + 1));
    BufferedFile::BufferedFile(&bf,&local_c0,(long)(iVar6 + 1),nRewindIn);
    currentPos = 0;
    local_330 = 0;
    uVar13 = 0;
    while ((uVar13 < 100 && (currentPos < uVar8))) {
      local_130 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
      ;
      local_128 = "";
      local_140 = &boost::unit_test::basic_cstring<char_const>::null;
      local_138 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x1cb;
      file.m_begin = (iterator)&local_130;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_140,msg)
      ;
      _cVar15 = 0x51b8a3;
      bVar4 = BufferedFile::eof(&bf);
      a[0] = !bVar4;
      sStack_90.pi_ = (sp_counted_base *)0x0;
      _i_1 = "!bf.eof()";
      local_168 = "";
      local_160.m_empty = false;
      local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
      local_150 = boost::unit_test::lazy_ostream::inst;
      local_148 = &i_1;
      local_180 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
      ;
      local_178 = "";
      pvVar10 = &DAT_00000001;
      pvVar11 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)a,&local_160,1,0,WARN,_cVar15,(size_t)&local_180,0x1cb);
      boost::detail::shared_count::~shared_count(&sStack_90);
      local_190 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
      ;
      local_188 = "";
      local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_198 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x1cc;
      file_00.m_begin = (iterator)&local_190;
      msg_00.m_end = pvVar11;
      msg_00.m_begin = pvVar10;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
                 msg_00);
      local_160.m_empty = false;
      local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
      local_150 = boost::unit_test::lazy_ostream::inst;
      local_148 = "";
      local_1b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
      ;
      local_1a8 = "";
      _a = bf.m_read_pos;
      in_R8 = (iterator)0x2;
      in_R9 = (bool *)a;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (&local_160,&local_1b0,0x1cc,1,2,in_R9,"bf.GetPos()",&currentPos,"currentPos");
      iVar6 = RandomMixin<FastRandomContext>::randrange<int>
                        (&this_00->super_RandomMixin<FastRandomContext>,6);
      sVar3 = currentPos;
      switch(iVar6) {
      case 0:
        uVar1 = currentPos + 1;
        if (uVar1 <= uVar8) {
          if (bf.m_read_pos <= uVar1) {
            bf.nReadLimit = uVar1;
          }
          Unserialize<BufferedFile,_unsigned_char,_1>(&bf,&a);
          local_1c0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_1b8 = "";
          local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_01.m_end = (iterator)0x1da;
          file_01.m_begin = (iterator)&local_1c0;
          msg_01.m_end = in_R9;
          msg_01.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_1d0,msg_01);
          local_160.m_empty = false;
          local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
          local_150 = boost::unit_test::lazy_ostream::inst;
          local_148 = "";
          local_1e0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_1d8 = "";
          in_R8 = (iterator)0x2;
          in_R9 = (bool *)a;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_long>
                    (&local_160,&local_1e0,0x1da,1,2,in_R9,"a[i]",&currentPos,"currentPos");
          goto LAB_0051bd92;
        }
        goto LAB_0051c2b3;
      case 1:
        uVar1 = currentPos + 2;
        if (uVar8 < uVar1) goto LAB_0051c2b3;
        if (bf.m_read_pos <= uVar1) {
          bf.nReadLimit = uVar1;
        }
        Unserialize<BufferedFile,_unsigned_char,_2>(&bf,(uchar (*) [2])a);
        for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
          local_1f0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_1e8 = "";
          local_200 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_05.m_end = (iterator)0x1e6;
          file_05.m_begin = (iterator)&local_1f0;
          msg_05.m_end = in_R9;
          msg_05.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                     (size_t)&local_200,msg_05);
          local_160.m_empty = false;
          local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
          local_150 = boost::unit_test::lazy_ostream::inst;
          local_148 = "";
          local_210 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_208 = "";
          in_R9 = (bool *)(a + lVar14);
          in_R8 = (iterator)0x2;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_long>
                    (&local_160,&local_210,0x1e6,1,2,in_R9,"a[i]",&currentPos,"currentPos");
          currentPos = currentPos + 1;
        }
        break;
      case 2:
        uVar1 = currentPos + 5;
        if (uVar8 < uVar1) goto LAB_0051c2b3;
        if (bf.m_read_pos <= uVar1) {
          bf.nReadLimit = uVar1;
        }
        Unserialize<BufferedFile,_unsigned_char,_5>(&bf,(uchar (*) [5])a);
        for (lVar14 = 0; lVar14 != 5; lVar14 = lVar14 + 1) {
          local_220 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_218 = "";
          local_230 = &boost::unit_test::basic_cstring<char_const>::null;
          local_228 = &boost::unit_test::basic_cstring<char_const>::null;
          file_04.m_end = (iterator)0x1f2;
          file_04.m_begin = (iterator)&local_220;
          msg_04.m_end = in_R9;
          msg_04.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                     (size_t)&local_230,msg_04);
          local_160.m_empty = false;
          local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
          local_150 = boost::unit_test::lazy_ostream::inst;
          local_148 = "";
          local_240 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_238 = "";
          in_R9 = (bool *)(a + lVar14);
          in_R8 = (iterator)0x2;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_long>
                    (&local_160,&local_240,0x1f2,1,2,in_R9,"a[i]",&currentPos,"currentPos");
          currentPos = currentPos + 1;
        }
        break;
      case 3:
        iVar6 = RandomMixin<FastRandomContext>::randrange<int>
                          (&this_00->super_RandomMixin<FastRandomContext>,5);
        uVar1 = currentPos + (long)iVar6;
        if (uVar8 < uVar1) goto LAB_0051c2b3;
        if (bf.m_read_pos <= uVar1) {
          bf.nReadLimit = uVar1;
        }
        BufferedFile::SkipTo(&bf,uVar1);
        currentPos = currentPos + (long)iVar6;
        break;
      case 4:
        iVar6 = RandomMixin<FastRandomContext>::randrange<int>
                          (&this_00->super_RandomMixin<FastRandomContext>,8);
        _a = (long)iVar6 + sVar3;
        if (uVar8 <= (long)iVar6 + sVar3) {
          _a = uVar8 - 1;
        }
        BufferedFile::FindByte(&bf,(byte)_a);
        local_250 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
        ;
        local_248 = "";
        local_260 = &boost::unit_test::basic_cstring<char_const>::null;
        local_258 = &boost::unit_test::basic_cstring<char_const>::null;
        file_02.m_end = (iterator)0x208;
        file_02.m_begin = (iterator)&local_250;
        msg_02.m_end = in_R9;
        msg_02.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_260
                   ,msg_02);
        local_160.m_empty = false;
        local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
        local_150 = boost::unit_test::lazy_ostream::inst;
        local_148 = "";
        local_270 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
        ;
        local_268 = "";
        _i_1 = (char *)bf.m_read_pos;
        pvVar10 = (iterator)0x2;
        puVar12 = &i_1;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                  (&local_160,&local_270,0x208,1,2,puVar12,"bf.GetPos()",a,"find");
        currentPos = _a;
        if (bf.m_read_pos <= _a + 1) {
          bf.nReadLimit = _a + 1;
        }
        uVar5 = ser_readdata8<BufferedFile>(&bf);
        _i_1 = (char *)CONCAT71(uStack_16f,uVar5);
        local_280 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
        ;
        local_278 = "";
        local_290 = &boost::unit_test::basic_cstring<char_const>::null;
        local_288 = &boost::unit_test::basic_cstring<char_const>::null;
        file_03.m_end = (iterator)0x20e;
        file_03.m_begin = (iterator)&local_280;
        msg_03.m_end = (iterator)puVar12;
        msg_03.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_290
                   ,msg_03);
        local_160.m_empty = false;
        local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
        local_150 = boost::unit_test::lazy_ostream::inst;
        local_148 = "";
        local_2a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
        ;
        local_298 = "";
        in_R8 = (iterator)0x2;
        in_R9 = (bool *)&i_1;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_long>
                  (&local_160,&local_2a0,0x20e,1,2,in_R9,"i",&currentPos,"currentPos");
LAB_0051bd92:
        currentPos = currentPos + 1;
        break;
      case 5:
        uVar9 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                          (&this_00->super_RandomMixin<FastRandomContext>,local_330 + 4);
        currentPos = uVar9;
        if (uVar9 > bf.nSrcPos) {
          currentPos = bf.nSrcPos;
        }
        bVar4 = bf.nSrcPos <=
                ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start) + uVar9;
        if (!bVar4) {
          currentPos = bf.nSrcPos -
                       ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                             _M_impl.super__Vector_impl_data._M_start);
        }
        okay = bVar4 && uVar9 <= bf.nSrcPos;
        local_2b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
        ;
        local_2b0 = "";
        local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_06.m_end = (iterator)0x21a;
        file_06.m_begin = (iterator)&local_2b8;
        msg_06.m_end = in_R9;
        msg_06.m_begin = in_R8;
        bf.m_read_pos = currentPos;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2c8
                   ,msg_06);
        local_160.m_empty = false;
        local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
        local_150 = boost::unit_test::lazy_ostream::inst;
        local_148 = "";
        local_2d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
        ;
        local_2d0 = "";
        _a = CONCAT71(uStack_9f,currentPos == uVar9);
        in_R8 = (iterator)0x2;
        in_R9 = &okay;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                  (&local_160,&local_2d8,0x21a,1,2,in_R9,"okay",a,"currentPos == requestPos");
        if (((local_330 - nRewindIn <= uVar9) && (nRewindIn < local_330)) && (uVar9 <= local_330)) {
          local_2e8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_2e0 = "";
          local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
          _cVar15 = 0x51c1b3;
          file_07.m_end = (iterator)0x220;
          file_07.m_begin = (iterator)&local_2e8;
          msg_07.m_end = in_R9;
          msg_07.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                     (size_t)&local_2f8,msg_07);
          _a = CONCAT71(uStack_9f,okay);
          sStack_90.pi_ = (sp_counted_base *)0x0;
          _i_1 = "okay";
          local_168 = "";
          local_160.m_empty = false;
          local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
          local_150 = boost::unit_test::lazy_ostream::inst;
          local_148 = &i_1;
          local_308 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
          ;
          local_300 = "";
          in_R8 = &DAT_00000001;
          in_R9 = (bool *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)a,&local_160,1,0,WARN,_cVar15,(size_t)&local_308,0x220);
          boost::detail::shared_count::~shared_count(&sStack_90);
        }
      }
      if (local_330 <= currentPos) {
        local_330 = currentPos;
      }
LAB_0051c2b3:
      uVar13 = uVar13 + 1;
    }
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    AutoFile::~AutoFile(&local_c0);
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_buffered_file_rand)
{
    // Make this test deterministic.
    SeedRandomForTest(SeedRand::ZEROS);

    fs::path streams_test_filename = m_args.GetDataDirBase() / "streams_test_tmp";
    for (int rep = 0; rep < 50; ++rep) {
        AutoFile file{fsbridge::fopen(streams_test_filename, "w+b")};
        size_t fileSize = m_rng.randrange(256);
        for (uint8_t i = 0; i < fileSize; ++i) {
            file << i;
        }
        std::rewind(file.Get());

        size_t bufSize = m_rng.randrange(300) + 1;
        size_t rewindSize = m_rng.randrange(bufSize);
        BufferedFile bf{file, bufSize, rewindSize};
        size_t currentPos = 0;
        size_t maxPos = 0;
        for (int step = 0; step < 100; ++step) {
            if (currentPos >= fileSize)
                break;

            // We haven't read to the end of the file yet.
            BOOST_CHECK(!bf.eof());
            BOOST_CHECK_EQUAL(bf.GetPos(), currentPos);

            // Pretend the file consists of a series of objects of varying
            // sizes; the boundaries of the objects can interact arbitrarily
            // with the CBufferFile's internal buffer. These first three
            // cases simulate objects of various sizes (1, 2, 5 bytes).
            switch (m_rng.randrange(6)) {
            case 0: {
                uint8_t a[1];
                if (currentPos + 1 > fileSize)
                    continue;
                bf.SetLimit(currentPos + 1);
                bf >> a;
                for (uint8_t i = 0; i < 1; ++i) {
                    BOOST_CHECK_EQUAL(a[i], currentPos);
                    currentPos++;
                }
                break;
            }
            case 1: {
                uint8_t a[2];
                if (currentPos + 2 > fileSize)
                    continue;
                bf.SetLimit(currentPos + 2);
                bf >> a;
                for (uint8_t i = 0; i < 2; ++i) {
                    BOOST_CHECK_EQUAL(a[i], currentPos);
                    currentPos++;
                }
                break;
            }
            case 2: {
                uint8_t a[5];
                if (currentPos + 5 > fileSize)
                    continue;
                bf.SetLimit(currentPos + 5);
                bf >> a;
                for (uint8_t i = 0; i < 5; ++i) {
                    BOOST_CHECK_EQUAL(a[i], currentPos);
                    currentPos++;
                }
                break;
            }
            case 3: {
                // SkipTo is similar to the "read" cases above, except
                // we don't receive the data.
                size_t skip_length{static_cast<size_t>(m_rng.randrange(5))};
                if (currentPos + skip_length > fileSize) continue;
                bf.SetLimit(currentPos + skip_length);
                bf.SkipTo(currentPos + skip_length);
                currentPos += skip_length;
                break;
            }
            case 4: {
                // Find a byte value (that is at or ahead of the current position).
                size_t find = currentPos + m_rng.randrange(8);
                if (find >= fileSize)
                    find = fileSize - 1;
                bf.FindByte(std::byte(find));
                // The value at each offset is the offset.
                BOOST_CHECK_EQUAL(bf.GetPos(), find);
                currentPos = find;

                bf.SetLimit(currentPos + 1);
                uint8_t i;
                bf >> i;
                BOOST_CHECK_EQUAL(i, currentPos);
                currentPos++;
                break;
            }
            case 5: {
                size_t requestPos = m_rng.randrange(maxPos + 4);
                bool okay = bf.SetPos(requestPos);
                // The new position may differ from the requested position
                // because we may not be able to rewind beyond the rewind
                // window, and we may not be able to move forward beyond the
                // farthest position we've reached so far.
                currentPos = bf.GetPos();
                BOOST_CHECK_EQUAL(okay, currentPos == requestPos);
                // Check that we can position within the rewind window.
                if (requestPos <= maxPos &&
                    maxPos > rewindSize &&
                    requestPos >= maxPos - rewindSize) {
                    // We requested a position within the rewind window.
                    BOOST_CHECK(okay);
                }
                break;
            }
            }
            if (maxPos < currentPos)
                maxPos = currentPos;
        }
    }
    fs::remove(streams_test_filename);
}